

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgDmaSendSwap(void)

{
  uint uVar1;
  uint err;
  
  uVar1 = zvgDmaStart(ZvgIO.dmaCurP,ZvgIO.dmaCurCount);
  if (uVar1 == 0) {
    if (ZvgIO.dmaCurP == ZvgIO.dmaBf1P) {
      ZvgIO.dmaBf1Count = ZvgIO.dmaCurCount;
      ZvgIO.dmaCurP = ZvgIO.dmaBf2P;
    }
    else {
      ZvgIO.dmaBf2Count = ZvgIO.dmaCurCount;
      ZvgIO.dmaCurP = ZvgIO.dmaBf1P;
    }
  }
  ZvgIO.dmaCurCount = 0;
  return uVar1;
}

Assistant:

uint zvgDmaSendSwap( void)
{
	uint	err;

	err = zvgDmaStart( ZvgIO.dmaCurP, ZvgIO.dmaCurCount);

	if (!err)
	{
		if (ZvgIO.dmaCurP == ZvgIO.dmaBf1P)
		{	ZvgIO.dmaBf1Count = ZvgIO.dmaCurCount;			// keep track of count for possible resend
			ZvgIO.dmaCurP = ZvgIO.dmaBf2P;					// point to 2nd buffer
		}
		else
		{	ZvgIO.dmaBf2Count = ZvgIO.dmaCurCount;			// keep track of count for possible resend
			ZvgIO.dmaCurP = ZvgIO.dmaBf1P;					// point to 1st buffer
		}
		ZvgIO.dmaCurCount = 0;								// clear buffer
	}

	ZvgIO.dmaCurCount = 0;
	return (err);
}